

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_lset(mbedtls_mpi *X,mbedtls_mpi_sint z)

{
  int iVar1;
  mbedtls_mpi_uint mVar2;
  
  iVar1 = mbedtls_mpi_grow(X,1);
  if (iVar1 == 0) {
    switchD_014c69ad::default(X->p,0,(ulong)X->n << 3);
    mVar2 = -z;
    if (0 < z) {
      mVar2 = z;
    }
    *X->p = mVar2;
    X->s = (ushort)(z >> 0x3e) | 1;
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_lset(mbedtls_mpi *X, mbedtls_mpi_sint z)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, 1));
    memset(X->p, 0, X->n * ciL);

    X->p[0] = mpi_sint_abs(z);
    X->s    = TO_SIGN(z);

cleanup:

    return ret;
}